

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

uint8 * __thiscall
caffe::EltwiseParameter::InternalSerializeWithCachedSizesToArray
          (EltwiseParameter *this,bool deterministic,uint8 *target)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  Rep *pRVar4;
  void *pvVar5;
  bool bVar6;
  byte *pbVar7;
  LogMessage *other;
  ulong uVar8;
  ulong uVar9;
  LogFinisher local_69;
  LogMessage local_68;
  
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 1) != 0) {
    uVar8 = (ulong)this->operation_;
    pbVar7 = target + 1;
    *target = '\b';
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar7 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar7 = pbVar7 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar7 = (byte)uVar9;
    target = pbVar7 + 1;
  }
  uVar3 = (this->coeff_).current_size_;
  if (uVar3 != 0) {
    if ((this->coeff_).rep_ == (Rep *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      other = google::protobuf::internal::LogMessage::operator<<(&local_68,"CHECK failed: rep_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_69,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    pRVar4 = (this->coeff_).rep_;
    uVar8 = 1;
    if (1 < (int)uVar3) {
      uVar8 = (ulong)uVar3;
    }
    uVar9 = 0;
    do {
      fVar1 = pRVar4->elements[uVar9];
      *target = 0x15;
      *(float *)(target + 1) = fVar1;
      target = target + 5;
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if ((uVar2 & 2) != 0) {
    bVar6 = this->stable_prod_grad_;
    *target = 0x18;
    target[1] = bVar6;
    target = target + 2;
  }
  pvVar5 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar5 & 1) != 0) {
    target = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe),target);
  }
  return target;
}

Assistant:

::google::protobuf::uint8* EltwiseParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.EltwiseParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .caffe.EltwiseParameter.EltwiseOp operation = 1 [default = SUM];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      1, this->operation(), target);
  }

  // repeated float coeff = 2;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteFloatToArray(2, this->coeff_, target);

  // optional bool stable_prod_grad = 3 [default = true];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(3, this->stable_prod_grad(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.EltwiseParameter)
  return target;
}